

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOBLoader.cpp
# Opt level: O3

void __thiscall Assimp::LWOImporter::LoadLWOBPolygons(LWOImporter *this,uint length)

{
  uint16_t *end;
  uint iNumVertices;
  uint iNumFaces;
  iterator it;
  ushort *local_30;
  uint local_28;
  uint local_24;
  iterator local_20;
  
  local_30 = (ushort *)this->mFileBuffer;
  end = (uint16_t *)((ulong)length + (long)local_30);
  if (length != 0) {
    do {
      if (local_30 == (ushort *)0x0) {
        __assert_fail("_szOut",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/ByteSwapper.h"
                      ,0x4e,"static void Assimp::ByteSwap::Swap2(void *)");
      }
      *local_30 = *local_30 << 8 | *local_30 >> 8;
      local_30 = local_30 + 1;
    } while (local_30 < end);
    local_30 = (ushort *)this->mFileBuffer;
  }
  local_24 = 0;
  local_28 = 0;
  CountVertsAndFacesLWOB(this,&local_28,&local_24,&local_30,end,0xffffffff);
  if ((ulong)local_24 != 0) {
    local_30 = (ushort *)this->mFileBuffer;
    std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::resize
              (&this->mCurLayer->mFaces,(ulong)local_24);
    local_20._M_current =
         (this->mCurLayer->mFaces).
         super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
         super__Vector_impl_data._M_start;
    CopyFaceIndicesLWOB(this,&local_20,&local_30,end,0xffffffff);
  }
  return;
}

Assistant:

void LWOImporter::LoadLWOBPolygons(unsigned int length)
{
    // first find out how many faces and vertices we'll finally need
    LE_NCONST uint16_t* const end   = (LE_NCONST uint16_t*)(mFileBuffer+length);
    LE_NCONST uint16_t* cursor      = (LE_NCONST uint16_t*)mFileBuffer;

    // perform endianness conversions
#ifndef AI_BUILD_BIG_ENDIAN
    while (cursor < end)ByteSwap::Swap2(cursor++);
    cursor = (LE_NCONST uint16_t*)mFileBuffer;
#endif

    unsigned int iNumFaces = 0,iNumVertices = 0;
    CountVertsAndFacesLWOB(iNumVertices,iNumFaces,cursor,end);

    // allocate the output array and copy face indices
    if (iNumFaces)
    {
        cursor = (LE_NCONST uint16_t*)mFileBuffer;

        mCurLayer->mFaces.resize(iNumFaces);
        FaceList::iterator it = mCurLayer->mFaces.begin();
        CopyFaceIndicesLWOB(it,cursor,end);
    }
}